

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindEnumCodeFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PhysicalType PVar3;
  reference pvVar4;
  type expr;
  pointer pEVar5;
  BinderException *this_00;
  InternalException *this_01;
  LogicalTypeId id;
  string local_40;
  
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar4);
  CheckEnumParameter(expr);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if ((pEVar5->return_type).id_ == ENUM) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    PVar3 = EnumType::GetPhysicalType(&pEVar5->return_type);
    switch(PVar3) {
    case UINT8:
      id = UTINYINT;
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported Enum Internal Type","");
      InternalException::InternalException(this_01,&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UINT16:
      id = USMALLINT;
      break;
    case UINT32:
      id = UINTEGER;
      break;
    case UINT64:
      id = UBIGINT;
    }
    LogicalType::LogicalType((LogicalType *)&local_40,id);
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_40._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_40._M_dataplus._M_p._1_1_;
    peVar1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._M_allocated_capacity;
    local_40._M_string_length = (size_type)peVar1;
    local_40.field_2._M_allocated_capacity = (size_type)p_Var2;
    LogicalType::~LogicalType((LogicalType *)&local_40);
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"This function needs an ENUM as an argument","");
  BinderException::BinderException(this_00,&local_40);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindEnumCodeFunction(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	CheckEnumParameter(*arguments[0]);
	if (arguments[0]->return_type.id() != LogicalTypeId::ENUM) {
		throw BinderException("This function needs an ENUM as an argument");
	}

	auto phy_type = EnumType::GetPhysicalType(arguments[0]->return_type);
	switch (phy_type) {
	case PhysicalType::UINT8:
		bound_function.return_type = LogicalType(LogicalTypeId::UTINYINT);
		break;
	case PhysicalType::UINT16:
		bound_function.return_type = LogicalType(LogicalTypeId::USMALLINT);
		break;
	case PhysicalType::UINT32:
		bound_function.return_type = LogicalType(LogicalTypeId::UINTEGER);
		break;
	case PhysicalType::UINT64:
		bound_function.return_type = LogicalType(LogicalTypeId::UBIGINT);
		break;
	default:
		throw InternalException("Unsupported Enum Internal Type");
	}

	return nullptr;
}